

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void * get_component(ecs_entity_info_t *info,ecs_entity_t component)

{
  ecs_vector_t *vector;
  int32_t iVar1;
  void *pvVar2;
  int local_3c;
  int count;
  int i;
  ecs_entity_t *ids;
  ecs_type_t type;
  ecs_table_t *table;
  ecs_entity_t component_local;
  ecs_entity_info_t *info_local;
  
  _ecs_assert(info->table != (ecs_table_t *)0x0,0xc,(char *)0x0,"info->table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x35);
  if (info->table == (ecs_table_t *)0x0) {
    __assert_fail("info->table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x35,"void *get_component(ecs_entity_info_t *, ecs_entity_t)");
  }
  _ecs_assert(component != 0,0xc,(char *)0x0,"component != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x36);
  if (component != 0) {
    _ecs_assert(-1 < info->row,0xc,(char *)0x0,"info->row >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x37);
    if (info->row < 0) {
      __assert_fail("info->row >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x37,"void *get_component(ecs_entity_info_t *, ecs_entity_t)");
    }
    vector = info->table->type;
    pvVar2 = _ecs_vector_first(vector,8,0x10);
    iVar1 = ecs_vector_count(vector);
    local_3c = 0;
    while( true ) {
      if (iVar1 <= local_3c) {
        return (void *)0x0;
      }
      if (*(ecs_entity_t *)((long)pvVar2 + (long)local_3c * 8) == component) break;
      local_3c = local_3c + 1;
    }
    pvVar2 = get_component_w_index(info,local_3c);
    return pvVar2;
  }
  __assert_fail("component != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x36,"void *get_component(ecs_entity_info_t *, ecs_entity_t)");
}

Assistant:

static
void* get_component(
    ecs_entity_info_t *info,
    ecs_entity_t component)
{
    ecs_assert(info->table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(component != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(info->row >= 0, ECS_INTERNAL_ERROR, NULL);

    ecs_table_t *table = info->table;
    ecs_type_t type = table->type;

    ecs_entity_t *ids = ecs_vector_first(type, ecs_entity_t);

    /* The table column_count contains the maximum column index that actually
     * contains data. This excludes component ids that do not have data, such
     * as tags. Therefore it is faster to iterate column_count vs. all the
     * elements in the type.
     *
     * The downside of this is that the code can't always detect when an 
     * application attempts to get the value of a tag (which is not allowed). To
     * ensure consistent behavior in debug mode, the entire type is iterated as
     * this guarantees that the code will assert when attempting to obtain the
     * value of a tag. */
#ifndef NDEBUG
    int i, count = ecs_vector_count(type);
#else
    int i, count = table->column_count;
#endif

    for (i = 0; i < count; i ++) {
        if (ids[i] == component) {
            return get_component_w_index(info, i);
        }
    }

    return NULL;
}